

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3auxBestIndexMethod(sqlite3_vtab *pVTab,sqlite3_index_info *pInfo)

{
  uchar uVar1;
  int iVar2;
  int iCol;
  int op;
  int iNext;
  int iLangid;
  int iLe;
  int iGe;
  int iEq;
  int i;
  sqlite3_index_info *pInfo_local;
  sqlite3_vtab *pVTab_local;
  
  iLe = -1;
  iLangid = -1;
  iNext = -1;
  op = -1;
  iCol = 1;
  if (((pInfo->nOrderBy == 1) && (pInfo->aOrderBy->iColumn == 0)) && (pInfo->aOrderBy->desc == '\0')
     ) {
    pInfo->orderByConsumed = 1;
  }
  for (iGe = 0; iGe < pInfo->nConstraint; iGe = iGe + 1) {
    if (pInfo->aConstraint[iGe].usable != '\0') {
      uVar1 = pInfo->aConstraint[iGe].op;
      iVar2 = pInfo->aConstraint[iGe].iColumn;
      if (iVar2 == 0) {
        if (uVar1 == '\x02') {
          iLe = iGe;
        }
        if (uVar1 == '\x10') {
          iNext = iGe;
        }
        if (uVar1 == '\b') {
          iNext = iGe;
        }
        if (uVar1 == '\x04') {
          iLangid = iGe;
        }
        if (uVar1 == ' ') {
          iLangid = iGe;
        }
      }
      if ((iVar2 == 4) && (uVar1 == '\x02')) {
        op = iGe;
      }
    }
  }
  if (iLe < 0) {
    pInfo->idxNum = 0;
    pInfo->estimatedCost = 20000.0;
    if (-1 < iLangid) {
      pInfo->idxNum = pInfo->idxNum + 2;
      iCol = 2;
      pInfo->aConstraintUsage[iLangid].argvIndex = 1;
      pInfo->estimatedCost = pInfo->estimatedCost / 2.0;
    }
    if (-1 < iNext) {
      pInfo->idxNum = pInfo->idxNum + 4;
      pInfo->aConstraintUsage[iNext].argvIndex = iCol;
      pInfo->estimatedCost = pInfo->estimatedCost / 2.0;
      iCol = iCol + 1;
    }
  }
  else {
    pInfo->idxNum = 1;
    pInfo->aConstraintUsage[iLe].argvIndex = 1;
    pInfo->estimatedCost = 5.0;
    iCol = 2;
  }
  if (-1 < op) {
    pInfo->aConstraintUsage[op].argvIndex = iCol;
    pInfo->estimatedCost = pInfo->estimatedCost + -1.0;
  }
  return 0;
}

Assistant:

static int fts3auxBestIndexMethod(
  sqlite3_vtab *pVTab, 
  sqlite3_index_info *pInfo
){
  int i;
  int iEq = -1;
  int iGe = -1;
  int iLe = -1;
  int iLangid = -1;
  int iNext = 1;                  /* Next free argvIndex value */

  UNUSED_PARAMETER(pVTab);

  /* This vtab delivers always results in "ORDER BY term ASC" order. */
  if( pInfo->nOrderBy==1 
   && pInfo->aOrderBy[0].iColumn==0 
   && pInfo->aOrderBy[0].desc==0
  ){
    pInfo->orderByConsumed = 1;
  }

  /* Search for equality and range constraints on the "term" column. 
  ** And equality constraints on the hidden "languageid" column. */
  for(i=0; i<pInfo->nConstraint; i++){
    if( pInfo->aConstraint[i].usable ){
      int op = pInfo->aConstraint[i].op;
      int iCol = pInfo->aConstraint[i].iColumn;

      if( iCol==0 ){
        if( op==SQLITE_INDEX_CONSTRAINT_EQ ) iEq = i;
        if( op==SQLITE_INDEX_CONSTRAINT_LT ) iLe = i;
        if( op==SQLITE_INDEX_CONSTRAINT_LE ) iLe = i;
        if( op==SQLITE_INDEX_CONSTRAINT_GT ) iGe = i;
        if( op==SQLITE_INDEX_CONSTRAINT_GE ) iGe = i;
      }
      if( iCol==4 ){
        if( op==SQLITE_INDEX_CONSTRAINT_EQ ) iLangid = i;
      }
    }
  }

  if( iEq>=0 ){
    pInfo->idxNum = FTS4AUX_EQ_CONSTRAINT;
    pInfo->aConstraintUsage[iEq].argvIndex = iNext++;
    pInfo->estimatedCost = 5;
  }else{
    pInfo->idxNum = 0;
    pInfo->estimatedCost = 20000;
    if( iGe>=0 ){
      pInfo->idxNum += FTS4AUX_GE_CONSTRAINT;
      pInfo->aConstraintUsage[iGe].argvIndex = iNext++;
      pInfo->estimatedCost /= 2;
    }
    if( iLe>=0 ){
      pInfo->idxNum += FTS4AUX_LE_CONSTRAINT;
      pInfo->aConstraintUsage[iLe].argvIndex = iNext++;
      pInfo->estimatedCost /= 2;
    }
  }
  if( iLangid>=0 ){
    pInfo->aConstraintUsage[iLangid].argvIndex = iNext++;
    pInfo->estimatedCost--;
  }

  return SQLITE_OK;
}